

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNodeSetContains(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr *ppxVar1;
  xmlNodePtr pxVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = 0;
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    if (val->type == XML_NAMESPACE_DECL) {
      iVar7 = 0;
      for (lVar6 = 0; lVar6 < cur->nodeNr; lVar6 = lVar6 + 1) {
        pxVar2 = cur->nodeTab[lVar6];
        if ((pxVar2->type == XML_NAMESPACE_DECL) &&
           ((pxVar2 == val ||
            (((val->_private != (void *)0x0 && (pxVar2->_private == val->_private)) &&
             (iVar4 = xmlStrEqual((xmlChar *)val->children,(xmlChar *)pxVar2->children), iVar4 != 0)
             ))))) {
          return 1;
        }
      }
    }
    else {
      uVar3 = cur->nodeNr;
      if (cur->nodeNr < 1) {
        uVar3 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar3 == uVar5) {
          return 0;
        }
        ppxVar1 = cur->nodeTab + uVar5;
        uVar5 = uVar5 + 1;
      } while (*ppxVar1 != val);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int
xmlXPathNodeSetContains (xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(0);
    if (val->type == XML_NAMESPACE_DECL) {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		xmlNsPtr ns1, ns2;

		ns1 = (xmlNsPtr) val;
		ns2 = (xmlNsPtr) cur->nodeTab[i];
		if (ns1 == ns2)
		    return(1);
		if ((ns1->next != NULL) && (ns2->next == ns1->next) &&
	            (xmlStrEqual(ns1->prefix, ns2->prefix)))
		    return(1);
	    }
	}
    } else {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i] == val)
		return(1);
	}
    }
    return(0);
}